

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *this,
          ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *other)

{
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *other_local;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
               0x0;
  other->endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }